

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruapu.h
# Opt level: O3

int ruapu_supports(char *isa)

{
  int iVar1;
  char *__s1;
  char **ppcVar2;
  
  if (g_ruapu_isa_supported[0] != (char *)0x0) {
    ppcVar2 = g_ruapu_isa_supported;
    __s1 = g_ruapu_isa_supported[0];
    do {
      ppcVar2 = ppcVar2 + 1;
      iVar1 = strcmp(__s1,isa);
      if (iVar1 == 0) {
        return 1;
      }
      __s1 = *ppcVar2;
    } while (__s1 != (char *)0x0);
  }
  return 0;
}

Assistant:

int ruapu_supports(const char* isa)
{
    const char* const* isa_supported = g_ruapu_isa_supported;
    while (*isa_supported)
    {
        if (strcmp(*isa_supported, isa) == 0)
            return 1;

        isa_supported++;
    }

    return 0;
}